

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_http_thread.c
# Opt level: O2

mk_http_thread *
mk_http_thread_create
          (int type,mk_vhost_handler *handler,mk_http_session *session,mk_http_request *request,
          int n_params,mk_list *params)

{
  mk_list *pmVar1;
  mk_sched_worker *pmVar2;
  mk_thread *pmVar3;
  cothread_t pvVar4;
  long lVar5;
  mk_http_libco_params *pmVar6;
  unsigned_long _zzq_result;
  size_t stack_size;
  unsigned_long _zzq_args [6];
  
  pmVar2 = mk_sched_get_thread_conf();
  if (pmVar2 != (mk_sched_worker *)0x0) {
    pmVar3 = (mk_thread *)malloc(0x58);
    if (pmVar3 != (mk_thread *)0x0) {
      pmVar3->cb_destroy = (_func_void_void_ptr *)0x0;
      pmVar3[1].caller = session;
      pmVar3[1].callee = request;
      pmVar3[1].data = pmVar3;
      pmVar3[1].valgrind_stack_id = 0;
      request->thread = (mk_http_thread *)(pmVar3 + 1);
      pmVar1 = (pmVar2->threads).prev;
      (pmVar2->threads).prev = (mk_list *)&pmVar3[1].cb_destroy;
      *(mk_list **)(pmVar3 + 2) = &pmVar2->threads;
      pmVar3[1].cb_destroy = (_func_void_void_ptr *)pmVar1;
      pmVar1->next = (mk_list *)&pmVar3[1].cb_destroy;
      pvVar4 = co_active();
      pmVar3->caller = pvVar4;
      lVar5 = __sysconf(0x4b);
      _zzq_args[1] = (unsigned_long)
                     co_create((uint)((lVar5 * 3) / 2),thread_cb_init_vars,&stack_size);
      pmVar3->callee = (cothread_t)_zzq_args[1];
      _zzq_args[0] = 0x1501;
      _zzq_args[2] = _zzq_args[1] + stack_size;
      _zzq_args[3] = 0;
      _zzq_args[4] = 0;
      _zzq_args[5] = 0;
      pmVar3->valgrind_stack_id = 0;
      pmVar6 = thread_get_libco_params();
      pmVar6->type = type;
      pmVar6->handler = handler;
      pmVar6->session = session;
      pmVar6->request = request;
      pmVar6->n_params = n_params;
      pmVar6->params = params;
      pmVar6->th = pmVar3;
      co_switch(pmVar3->callee);
      return (mk_http_thread *)(pmVar3 + 1);
    }
    perror("malloc");
  }
  return (mk_http_thread *)0x0;
}

Assistant:

struct mk_http_thread *mk_http_thread_create(int type,
                                             struct mk_vhost_handler *handler,
                                             struct mk_http_session *session,
                                             struct mk_http_request *request,
                                             int n_params,
                                             struct mk_list *params)
{
    size_t stack_size;
    struct mk_thread *th = NULL;
    struct mk_http_thread *mth;
    struct mk_sched_worker *sched;

    sched = mk_sched_get_thread_conf();
    if (!sched) {
        return NULL;
    }

    th = mk_thread_new(sizeof(struct mk_http_thread), NULL);
    if (!th) {
        return NULL;
    }

    mth = (struct mk_http_thread *) MK_THREAD_DATA(th);
    if (!mth) {
        return NULL;
    }

    mth->session = session;
    mth->request = request;
    mth->parent  = th;
    mth->close   = MK_FALSE;
    request->thread = mth;
    mk_list_add(&mth->_head, &sched->threads);

    th->caller = co_active();
    th->callee = co_create(MK_THREAD_STACK_SIZE,
                           thread_cb_init_vars, &stack_size);

#ifdef MK_HAVE_VALGRIND
    th->valgrind_stack_id = VALGRIND_STACK_REGISTER(th->callee,
                                                    ((char *)th->callee) + stack_size);
#endif

    /* Workaround for makecontext() */
    thread_params_set(th, type, handler, session, request, n_params, params);

    return mth;
}